

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumValueDescriptor::GetLocationPath
          (EnumValueDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int local_20;
  int local_1c;
  
  EnumDescriptor::GetLocationPath(*(EnumDescriptor **)(this + 0x18),output);
  local_20 = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_20);
  local_1c = (int)(((long)this - *(long *)(*(long *)(this + 0x18) + 0x30)) / 0x28);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_1c);
  return;
}

Assistant:

void EnumValueDescriptor::GetLocationPath(std::vector<int>* output) const {
  type()->GetLocationPath(output);
  output->push_back(EnumDescriptorProto::kValueFieldNumber);
  output->push_back(index());
}